

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 minMaxQuery(sqlite3 *db,Expr *pFunc,ExprList **ppMinMax)

{
  char *zLeft;
  int iVar1;
  ExprList *pEVar2;
  u8 local_49;
  u8 sortFlags;
  ExprList *pOrderBy;
  char *zFunc;
  ExprList *pEList;
  int eRet;
  ExprList **ppMinMax_local;
  Expr *pFunc_local;
  sqlite3 *db_local;
  
  local_49 = '\0';
  pEVar2 = (pFunc->x).pList;
  if ((((pEVar2 == (ExprList *)0x0) || (pEVar2->nExpr != 1)) || ((pFunc->flags & 0x1000000) != 0))
     || ((db->dbOptFlags & 0x10000) != 0)) {
    db_local._7_1_ = '\0';
  }
  else {
    zLeft = (pFunc->u).zToken;
    iVar1 = sqlite3StrICmp(zLeft,"min");
    if (iVar1 == 0) {
      pEList._4_1_ = '\x01';
      iVar1 = sqlite3ExprCanBeNull(pEVar2->a[0].pExpr);
      if (iVar1 != 0) {
        local_49 = '\x02';
      }
    }
    else {
      iVar1 = sqlite3StrICmp(zLeft,"max");
      if (iVar1 != 0) {
        return '\0';
      }
      pEList._4_1_ = '\x02';
      local_49 = '\x01';
    }
    pEVar2 = sqlite3ExprListDup(db,pEVar2,0);
    *ppMinMax = pEVar2;
    if (pEVar2 != (ExprList *)0x0) {
      pEVar2->a[0].fg.sortFlags = local_49;
    }
    db_local._7_1_ = pEList._4_1_;
  }
  return db_local._7_1_;
}

Assistant:

static u8 minMaxQuery(sqlite3 *db, Expr *pFunc, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;      /* Return value */
  ExprList *pEList;                     /* Arguments to agg function */
  const char *zFunc;                    /* Name of aggregate function pFunc */
  ExprList *pOrderBy;
  u8 sortFlags = 0;

  assert( *ppMinMax==0 );
  assert( pFunc->op==TK_AGG_FUNCTION );
  assert( !IsWindowFunc(pFunc) );
  assert( ExprUseXList(pFunc) );
  pEList = pFunc->x.pList;
  if( pEList==0
   || pEList->nExpr!=1
   || ExprHasProperty(pFunc, EP_WinFunc)
   || OptimizationDisabled(db, SQLITE_MinMaxOpt)
  ){
    return eRet;
  }
  assert( !ExprHasProperty(pFunc, EP_IntValue) );
  zFunc = pFunc->u.zToken;
  if( sqlite3StrICmp(zFunc, "min")==0 ){
    eRet = WHERE_ORDERBY_MIN;
    if( sqlite3ExprCanBeNull(pEList->a[0].pExpr) ){
      sortFlags = KEYINFO_ORDER_BIGNULL;
    }
  }else if( sqlite3StrICmp(zFunc, "max")==0 ){
    eRet = WHERE_ORDERBY_MAX;
    sortFlags = KEYINFO_ORDER_DESC;
  }else{
    return eRet;
  }
  *ppMinMax = pOrderBy = sqlite3ExprListDup(db, pEList, 0);
  assert( pOrderBy!=0 || db->mallocFailed );
  if( pOrderBy ) pOrderBy->a[0].fg.sortFlags = sortFlags;
  return eRet;
}